

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_open2(archive *_a,void *client_data,undefined1 *opener,
                       archive_write_callback *writer,undefined1 *closer,undefined1 *freer)

{
  int iVar1;
  int iVar2;
  archive_write_filter *paVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_open");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    archive_clear_error(_a);
    _a[1].error_string.s = (char *)writer;
    _a[1].error = opener;
    _a[1].error_string.length = (size_t)closer;
    _a[1].error_string.buffer_length = (size_t)freer;
    _a[1].current_code = (char *)client_data;
    paVar3 = __archive_write_allocate_filter(_a);
    if (paVar3 != (archive_write_filter *)0x0) {
      paVar3->open = archive_write_client_open;
      paVar3->write = archive_write_client_write;
      paVar3->close = archive_write_client_close;
      paVar3->free = archive_write_client_free;
      iVar2 = __archive_write_open_filter((archive_write_filter *)_a[1].sconv);
      if (iVar2 < -0x14) {
        iVar1 = __archive_write_filters_close((archive_write *)_a);
        __archive_write_filters_free(_a);
        if (iVar1 < iVar2) {
          iVar2 = iVar1;
        }
      }
      else {
        _a->state = 2;
        if ((code *)_a[1].read_data_remaining != (code *)0x0) {
          iVar2 = (*(code *)_a[1].read_data_remaining)(_a);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_open2(struct archive *_a, void *client_data,
    archive_open_callback *opener, archive_write_callback *writer,
    archive_close_callback *closer, archive_free_callback *freer)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *client_filter;
	int ret, r1;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_open");
	archive_clear_error(&a->archive);

	a->client_writer = writer;
	a->client_opener = opener;
	a->client_closer = closer;
	a->client_freer = freer;
	a->client_data = client_data;

	client_filter = __archive_write_allocate_filter(_a);

	if (client_filter == NULL)
		return (ARCHIVE_FATAL);

	client_filter->open = archive_write_client_open;
	client_filter->write = archive_write_client_write;
	client_filter->close = archive_write_client_close;
	client_filter->free = archive_write_client_free;

	ret = __archive_write_filters_open(a);
	if (ret < ARCHIVE_WARN) {
		r1 = __archive_write_filters_close(a);
		__archive_write_filters_free(_a);
		return (r1 < ret ? r1 : ret);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;
	if (a->format_init)
		ret = (a->format_init)(a);
	return (ret);
}